

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::PragmaTemplateNode::DumpToString(PragmaTemplateNode *this,int level,string *out)

{
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *out_local;
  PragmaTemplateNode *pPStack_10;
  int level_local;
  PragmaTemplateNode *this_local;
  
  local_20 = out;
  out_local._4_4_ = level;
  pPStack_10 = this;
  if (out != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Pragma Node: -->|",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"|<--\n",&local_79);
    AppendTokenWithIndent(level,out,(string *)local_40,&this->token_,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x43c,
                "virtual void ctemplate::PragmaTemplateNode::DumpToString(int, string *) const");
}

Assistant:

virtual void DumpToString(int level, string *out) const {
    assert(out);
    AppendTokenWithIndent(level, out, "Pragma Node: -->|", token_, "|<--\n");
  }